

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScaledBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
btScaledBvhTriangleMeshShape::getAabb
          (btScaledBvhTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  undefined8 uVar1;
  btBvhTriangleMeshShape *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  undefined1 auVar12 [16];
  float fVar14;
  btVector3 bVar15;
  btVector3 bVar16;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btVector3 localCenter;
  btMatrix3x3 abs_b;
  btScalar local_e8;
  btScalar bStack_e4;
  btScalar local_d8;
  float local_c8;
  btVector3 local_a8;
  btVector3 local_98;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  pbVar2 = this->m_bvhTriMeshShape;
  local_98.m_floats._0_8_ =
       *(undefined8 *)(pbVar2->super_btTriangleMeshShape).m_localAabbMin.m_floats;
  local_98.m_floats._8_8_ =
       *(undefined8 *)((pbVar2->super_btTriangleMeshShape).m_localAabbMin.m_floats + 2);
  local_a8.m_floats._0_8_ =
       *(undefined8 *)(pbVar2->super_btTriangleMeshShape).m_localAabbMax.m_floats;
  local_a8.m_floats._8_8_ =
       *(undefined8 *)((pbVar2->super_btTriangleMeshShape).m_localAabbMax.m_floats + 2);
  bVar15 = operator*(&local_98,&this->m_localScaling);
  bVar16 = operator*(&local_a8,&this->m_localScaling);
  uVar1 = *(undefined8 *)(this->m_localScaling).m_floats;
  fVar11 = (float)uVar1;
  fVar13 = (float)((ulong)uVar1 >> 0x20);
  uVar6 = -(uint)(fVar11 < 0.0);
  uVar7 = -(uint)(fVar13 < 0.0);
  local_e8 = bVar15.m_floats[0];
  bStack_e4 = bVar15.m_floats[1];
  fVar8 = (float)(~uVar6 & (uint)local_e8 | (uint)bVar16.m_floats[0] & uVar6);
  fVar10 = (float)(~uVar7 & (uint)bStack_e4 | (uint)bVar16.m_floats[1] & uVar7);
  fVar14 = (this->m_localScaling).m_floats[2];
  uVar6 = -(uint)(fVar14 < 0.0);
  local_d8 = bVar15.m_floats[2];
  fVar9 = (float)(~uVar6 & (uint)local_d8 | uVar6 & (uint)bVar16.m_floats[2]);
  local_98.m_floats[2] = fVar9;
  uVar6 = -(uint)(0.0 < fVar11);
  uVar7 = -(uint)(0.0 < fVar13);
  auVar12._0_4_ = ~uVar6 & (uint)local_e8;
  auVar12._4_4_ = ~uVar7 & (uint)bStack_e4;
  auVar12._8_4_ = extraout_XMM0_Dc;
  auVar12._12_4_ = extraout_XMM0_Dd;
  auVar3._4_4_ = (uint)bVar16.m_floats[1] & uVar7;
  auVar3._0_4_ = (uint)bVar16.m_floats[0] & uVar6;
  auVar3._8_8_ = 0;
  auVar12 = auVar12 | auVar3;
  local_a8.m_floats._0_8_ = auVar12._0_8_;
  uVar6 = -(uint)(0.0 < fVar14);
  fVar14 = (float)(~uVar6 & (uint)local_d8 | (uint)bVar16.m_floats[2] & uVar6);
  local_a8.m_floats[2] = fVar14;
  fVar14 = (fVar14 - fVar9) * 0.5;
  local_70.m_floats._8_8_ = ZEXT48((uint)fVar14);
  local_98.m_floats[0] = fVar8;
  local_98.m_floats[1] = fVar10;
  (*(this->m_bvhTriMeshShape->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape
    ._vptr_btCollisionShape[0xc])();
  local_e8 = auVar12._0_4_;
  bStack_e4 = auVar12._4_4_;
  local_70.m_floats[1] = extraout_XMM0_Da + (bStack_e4 - fVar10) * 0.5;
  local_70.m_floats[0] = extraout_XMM0_Da + (local_e8 - fVar8) * 0.5;
  local_70.m_floats[2] = fVar14 + extraout_XMM0_Da;
  local_80.m_floats[0] = (local_98.m_floats[0] + local_a8.m_floats[0]) * 0.5;
  local_80.m_floats[1] = (local_98.m_floats[1] + local_a8.m_floats[1]) * 0.5;
  local_80.m_floats[2] = (local_a8.m_floats[2] + local_98.m_floats[2]) * 0.5;
  local_80.m_floats[3] = 0.0;
  btMatrix3x3::absolute(&trans->m_basis);
  bVar15 = btTransform::operator()(trans,&local_80);
  bVar16 = btVector3::dot3(&local_70,&local_60,&local_50,&local_40);
  local_e8 = bVar15.m_floats[0];
  bStack_e4 = bVar15.m_floats[1];
  local_c8 = bVar15.m_floats[2];
  auVar4._4_4_ = bStack_e4 - bVar16.m_floats[1];
  auVar4._0_4_ = local_e8 - bVar16.m_floats[0];
  auVar4._8_4_ = local_c8 - bVar16.m_floats[2];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar4;
  auVar5._4_4_ = bStack_e4 + bVar16.m_floats[1];
  auVar5._0_4_ = local_e8 + bVar16.m_floats[0];
  auVar5._8_4_ = local_c8 + bVar16.m_floats[2];
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar5;
  return;
}

Assistant:

void	btScaledBvhTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{
	btVector3 localAabbMin = m_bvhTriMeshShape->getLocalAabbMin();
	btVector3 localAabbMax = m_bvhTriMeshShape->getLocalAabbMax();

	btVector3 tmpLocalAabbMin = localAabbMin * m_localScaling;
	btVector3 tmpLocalAabbMax = localAabbMax * m_localScaling;

	localAabbMin[0] = (m_localScaling.getX() >= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMin[1] = (m_localScaling.getY() >= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMin[2] = (m_localScaling.getZ() >= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];
	localAabbMax[0] = (m_localScaling.getX() <= 0.) ? tmpLocalAabbMin[0] : tmpLocalAabbMax[0];
	localAabbMax[1] = (m_localScaling.getY() <= 0.) ? tmpLocalAabbMin[1] : tmpLocalAabbMax[1];
	localAabbMax[2] = (m_localScaling.getZ() <= 0.) ? tmpLocalAabbMin[2] : tmpLocalAabbMax[2];

	btVector3 localHalfExtents = btScalar(0.5)*(localAabbMax-localAabbMin);
	btScalar margin = m_bvhTriMeshShape->getMargin();
	localHalfExtents += btVector3(margin,margin,margin);
	btVector3 localCenter = btScalar(0.5)*(localAabbMax+localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;

}